

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

int __thiscall re2::Regexp::Ref(Regexp *this)

{
  Mutex *this_00;
  uint *puVar1;
  uint uVar2;
  Regexp *local_20;
  
  this_00 = ref_mutex;
  uVar2 = (uint)this->ref_;
  if (this->ref_ == 0xffff) {
    Mutex::Lock(ref_mutex);
    local_20 = this;
    puVar1 = (uint *)std::
                     map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
                     ::operator[](ref_map,&local_20);
    uVar2 = *puVar1;
    Mutex::Unlock(this_00);
  }
  return uVar2;
}

Assistant:

int Regexp::Ref() {
  if (ref_ < kMaxRef)
    return ref_;

  MutexLock l(ref_mutex);
  return (*ref_map)[this];
}